

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::
FunctionMockerBase<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>)>
::UntypedPerformAction
          (FunctionMockerBase<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>)>
           *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<TestResult> *pAVar1;
  Action<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>)>
  action;
  linked_ptr<testing::ActionInterface<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>)>_>
  local_20;
  
  linked_ptr<testing::ActionInterface<TestResult(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>)>>
  ::
  copy<testing::ActionInterface<TestResult(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>)>>
            ((linked_ptr<testing::ActionInterface<TestResult(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>)>>
              *)&local_20,
             (linked_ptr<testing::ActionInterface<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>)>_>
              *)untyped_action);
  pAVar1 = ActionResultHolder<TestResult>::
           PerformAction<TestResult(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>)>
                     ((Action<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>)>
                       *)&local_20,(ArgumentTuple *)untyped_args);
  linked_ptr<testing::ActionInterface<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>)>_>
  ::~linked_ptr(&local_20);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }